

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O1

bool __thiscall cppnet::RWSocket::Recv(RWSocket *this,uint32_t len)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  SysCallInt32Result SVar7;
  int *piVar8;
  ulong uVar9;
  uint32_t len_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint32_t uVar10;
  uint uVar11;
  char cVar12;
  bool bVar13;
  vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> io_vec;
  shared_ptr<cppnet::InnerBuffer> local_78;
  Iovec *local_68;
  long lStack_60;
  undefined8 local_58;
  element_type *local_48;
  shared_ptr<cppnet::RWSocket> local_40;
  
  this_00 = (this->super_Socket)._cppnet_base.
            super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar5 = this_00->_M_use_count;
    do {
      if (iVar5 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar13 = iVar5 == iVar1;
      if (bVar13) {
        this_00->_M_use_count = iVar5 + 1;
        iVar1 = iVar5;
      }
      iVar5 = iVar1;
      UNLOCK();
    } while (!bVar13);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar13 = true;
  }
  else {
    bVar13 = this_00->_M_use_count == 0;
  }
  peVar2 = (this->super_Socket)._cppnet_base.
           super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  len_00 = 0;
  if (peVar2 != (element_type *)0x0 && !bVar13) {
    uVar10 = 0x1000;
    if (len != 0) {
      uVar10 = len;
    }
    bVar13 = false;
    local_48 = peVar2;
    do {
      uVar9 = (ulong)uVar10;
      uVar10 = uVar10 << (uVar10 < 0x10000 & bVar13);
      if (!bVar13) {
        uVar9 = 0;
      }
      local_68 = (Iovec *)0x0;
      lStack_60 = 0;
      local_58 = 0;
      peVar3 = (this->_read_buffer).
               super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar6 = (*(peVar3->super_InnerBuffer).super_Buffer._vptr_Buffer[0x10])(peVar3,&local_68,uVar9)
      ;
      SVar7 = OsHandle::Readv((this->super_Socket)._sock,local_68,
                              (uint32_t)((ulong)(lStack_60 - (long)local_68) >> 4));
      uVar11 = SVar7._return_value;
      if ((SVar7._errno == 0 || (long)SVar7 < 0) && -1 < (int)uVar11) {
        if (uVar11 == 0) {
          uVar4 = 1;
          goto LAB_0010dc03;
        }
        peVar3 = (this->_read_buffer).
                 super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*(peVar3->super_InnerBuffer).super_Buffer._vptr_Buffer[0xe])
                  (peVar3,(ulong)SVar7 & 0xffffffff);
        if (uVar6 <= uVar11) {
          bVar13 = true;
        }
        len_00 = len_00 + uVar11;
        cVar12 = (uVar11 < uVar6) * '\x03';
      }
      else {
        piVar8 = __errno_location();
        if ((*piVar8 == 0xb) || (uVar4 = 2, *piVar8 == 4)) {
          peVar3 = (this->_read_buffer).
                   super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*(peVar3->super_InnerBuffer).super_Buffer._vptr_Buffer[0xe])
                    (peVar3,(ulong)SVar7 & 0xffffffff);
          len_00 = len_00 + uVar11;
          cVar12 = '\x03';
        }
        else {
LAB_0010dc03:
          cVar12 = '\x01';
          (*(this->super_Socket)._vptr_Socket[0x11])(this,(ulong)uVar4);
        }
      }
      if (local_68 != (Iovec *)0x0) {
        operator_delete(local_68);
      }
    } while (cVar12 == '\0');
    if (cVar12 == '\x03') {
      std::__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<cppnet::RWSocket,void>
                ((__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2> *)&local_40,
                 (__weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<cppnet::RWSocket>);
      local_78.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &((this->_read_buffer).
             super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_InnerBuffer;
      local_78.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (this->_read_buffer).
             super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_78.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_78.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_78.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_78.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_78.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      CppNetBase::OnRead(local_48,&local_40,&local_78,len_00);
      if (local_78.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      len_00 = 1;
      if (local_40.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    else {
      len_00 = 0;
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return SUB41(len_00,0);
}

Assistant:

bool RWSocket::Recv(uint32_t len) {
    auto cppnet_base = _cppnet_base.lock();
    if (!cppnet_base) {
        return false;
    }
    if (len == 0) {
        len = __linux_read_buff_expand_len;
    }

    uint32_t off_set = 0;
    //read all data.
    uint32_t expand_buff_len = len;
    bool need_expend = false;
    while (true) {
        uint32_t expand = 0;
        if (need_expend) {
            expand = expand_buff_len;
            if (expand_buff_len < __linux_read_buff_expand_max) {
                expand_buff_len *= 2;
            }
        }

        std::vector<Iovec> io_vec;
        uint32_t buff_len = _read_buffer->GetFreeMemoryBlock(io_vec, expand);
        auto ret = OsHandle::Readv(_sock, &*io_vec.begin(), io_vec.size());
        if (ret._return_value < 0 || ret._errno > 0) {
            if (errno == EWOULDBLOCK || errno == EAGAIN || errno == EINTR) {
                _read_buffer->MoveWritePt(ret._return_value);
                off_set += ret._return_value;
                break;

            } else {
                OnDisConnect(CEC_CONNECT_BREAK);
                return false;
            }

        } else if (ret._return_value == 0) {
            OnDisConnect(CEC_CLOSED);
            return false;

        } else {
            _read_buffer->MoveWritePt(ret._return_value);
            off_set += ret._return_value;
            // read all
            if ((uint32_t)ret._return_value < buff_len) {
                break;
            }
            need_expend = true;
        }
    }
    cppnet_base->OnRead(shared_from_this(), _read_buffer, off_set);
    return true;
}